

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRep * absl::lts_20250127::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *tree,size_t n)

{
  int iVar1;
  ulong uVar2;
  size_t index;
  CordRep *pCVar3;
  CordRepBtree *pCVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  bool bVar8;
  bool is_mutable;
  Position PVar9;
  CopyResult CVar10;
  CordRepBtree *local_40;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x34b,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  uVar2 = (tree->super_CordRep).length;
  if (uVar2 < n) {
    __assert_fail("n <= tree->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x34c,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  if (n != 0) {
    sVar6 = uVar2 - n;
    if (uVar2 < n || sVar6 == 0) {
      CordRep::Unref(&tree->super_CordRep);
      tree = (CordRepBtree *)0x0;
    }
    else {
      uVar7 = (uint)(tree->super_CordRep).storage[0];
      is_mutable = (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2;
      while( true ) {
        PVar9 = IndexOfLength(tree,sVar6);
        index = PVar9.index;
        if (index != (tree->super_CordRep).storage[1]) break;
        pCVar3 = ExtractFront(tree);
        is_mutable = (bool)(is_mutable &
                           (pCVar3->refcount).count_.super___atomic_base<int>._M_i == 2);
        bVar8 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar8) {
          pCVar3 = anon_unknown_0::ResizeEdge(pCVar3,sVar6,is_mutable);
          return pCVar3;
        }
        tree = CordRep::btree(pCVar3);
      }
      tree = ConsumeBeginTo(tree,index + 1,sVar6);
      pCVar3 = Edge(tree,index);
      uVar5 = 0;
      local_40 = tree;
      while( true ) {
        sVar6 = PVar9.n;
        if (sVar6 == pCVar3->length) break;
        if ((local_40->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
          __assert_fail("tree->refcount.IsOne()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                        ,0x36e,
                        "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                       );
        }
        iVar1 = (pCVar3->refcount).count_.super___atomic_base<int>._M_i;
        if (uVar7 == uVar5) {
          pCVar3 = anon_unknown_0::ResizeEdge(pCVar3,sVar6,iVar1 == 2);
          local_40->edges_[PVar9.index] = pCVar3;
          break;
        }
        pCVar4 = CordRep::btree(pCVar3);
        if (iVar1 != 2) {
          CVar10 = CopyPrefix(pCVar4,sVar6,false);
          local_40->edges_[PVar9.index] = CVar10.edge;
          CordRep::Unref(pCVar3);
          break;
        }
        PVar9 = IndexOfLength(pCVar4,sVar6);
        pCVar4 = CordRep::btree(pCVar3);
        local_40 = ConsumeBeginTo(pCVar4,PVar9.index + 1,sVar6);
        pCVar3 = Edge(local_40,PVar9.index);
        uVar5 = uVar5 + 1;
      }
      AssertValid(tree,true);
    }
  }
  return &tree->super_CordRep;
}

Assistant:

CordRep* CordRepBtree::RemoveSuffix(CordRepBtree* tree, size_t n) {
  // Check input and deal with trivial cases 'Remove all/none'
  assert(tree != nullptr);
  assert(n <= tree->length);
  const size_t len = tree->length;
  if (ABSL_PREDICT_FALSE(n == 0)) {
    return tree;
  }
  if (ABSL_PREDICT_FALSE(n >= len)) {
    CordRepBtree::Unref(tree);
    return nullptr;
  }

  size_t length = len - n;
  int height = tree->height();
  bool is_mutable = tree->refcount.IsOne();

  // Extract all top nodes which are reduced to size = 1
  Position pos = tree->IndexOfLength(length);
  while (pos.index == tree->begin()) {
    CordRep* edge = ExtractFront(tree);
    is_mutable &= edge->refcount.IsOne();
    if (height-- == 0) return ResizeEdge(edge, length, is_mutable);
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
  }

  // Repeat the following sequence traversing down the tree:
  // - Crop the top node to the 'last remaining edge' adjusting length.
  // - Set the length for down edges to the partial length in that last edge.
  // - Repeat this until the last edge is 'included in full'
  // - If we hit the data edge level, resize and return the last data edge
  CordRepBtree* top = tree = ConsumeBeginTo(tree, pos.index + 1, length);
  CordRep* edge = tree->Edge(pos.index);
  length = pos.n;
  while (length != edge->length) {
    // ConsumeBeginTo guarantees `tree` is a clean, privately owned copy.
    assert(tree->refcount.IsOne());
    const bool edge_is_mutable = edge->refcount.IsOne();

    if (height-- == 0) {
      tree->edges_[pos.index] = ResizeEdge(edge, length, edge_is_mutable);
      return AssertValid(top);
    }

    if (!edge_is_mutable) {
      // We can't 'in place' remove any suffixes down this edge.
      // Replace this edge with a prefix copy instead.
      tree->edges_[pos.index] = edge->btree()->CopyPrefix(length, false).edge;
      CordRep::Unref(edge);
      return AssertValid(top);
    }

    // Move down one level, rinse repeat.
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
    tree = ConsumeBeginTo(edge->btree(), pos.index + 1, length);
    edge = tree->Edge(pos.index);
    length = pos.n;
  }

  return AssertValid(top);
}